

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

AppendResult __thiscall
metaf::MinMaxTemperatureGroup::appendForecast(MinMaxTemperatureGroup *this,string *group)

{
  Temperature *pTVar1;
  optional<metaf::MetafTime> *poVar2;
  bool bVar3;
  _Optional_payload_base<int> _Var4;
  _Optional_base<unsigned_int,_true,_true> _Var5;
  undefined8 uVar6;
  _Optional_payload_base<int> _Var7;
  _Optional_payload_base<int> _Var8;
  _Optional_payload_base<int> _Var9;
  _Optional_base<unsigned_int,_true,_true> _Var10;
  _Optional_base<unsigned_int,_true,_true> _Var11;
  undefined4 uVar12;
  float in_XMM1_Da;
  Temperature __tmp;
  optional<metaf::MinMaxTemperatureGroup> nextGroup;
  undefined2 uStack_70;
  optional<metaf::MinMaxTemperatureGroup> local_5c;
  
  if ((((this->minTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged == true) &&
      ((this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
       super__Optional_payload_base<int>._M_engaged == true)) && (this->isIncomplete != true)) {
    return NOT_APPENDED;
  }
  fromForecast(&local_5c,group);
  if (local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_engaged != true) {
    return NOT_APPENDED;
  }
  if (this->isIncomplete !=
      local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.isIncomplete)
  {
    return NOT_APPENDED;
  }
  pTVar1 = &this->minTemp;
  if (this->isIncomplete == false) {
    bVar3 = (this->minTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_engaged;
    if ((bVar3 == true) &&
       (local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.minTemp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
        ._M_engaged != false)) {
      return NOT_APPENDED;
    }
    if (((this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_engaged == true) &&
       (local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
        ._M_engaged != false)) {
      return NOT_APPENDED;
    }
    if ((bVar3 == false) &&
       (local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.minTemp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
        ._M_engaged == true)) {
      (this->minTemp).freezing =
           (bool)local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload
                 .super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._12_1_;
      (this->minTemp).precise =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.minTemp.
           precise;
      _Var4._4_4_ = local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                    _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>.
                    _M_payload._8_4_;
      _Var4._M_payload =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.minTemp.
           tempValue.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_payload;
      (pTVar1->tempValue).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> = _Var4;
      *(undefined4 *)
       &(this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._44_4_;
      (this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._28_8_;
      *(undefined8 *)
       ((long)&(this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._36_8_;
    }
    if (((this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_engaged == false) &&
       (local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
        ._M_engaged == true)) {
      (this->maxTemp).freezing =
           (bool)local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload
                 .super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._24_1_;
      (this->maxTemp).precise =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
           precise;
      _Var9._4_4_ = local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                    _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>.
                    _M_payload._20_4_;
      _Var9._M_payload._M_value =
           (int)local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
                super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.
                maxTemp.tempValue.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_payload;
      (this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> = _Var9;
      *(undefined4 *)
       &(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._64_4_;
      _Var5._M_payload.super__Optional_payload_base<unsigned_int>._4_4_ =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._52_4_;
      _Var5._M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._48_4_;
      (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           _Var5._M_payload.super__Optional_payload_base<unsigned_int>;
      *(ulong *)((long)&(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>.
                        _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) =
           CONCAT44(local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                    _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>.
                    _M_payload._60_4_,
                    local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                    _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>.
                    _M_payload._56_4_);
    }
    if ((this->minTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged == true) {
      if ((this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged != false) {
        return APPENDED;
      }
      return NOT_APPENDED;
    }
    return NOT_APPENDED;
  }
  (this->maxTemp).freezing =
       (bool)local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._24_1_;
  (this->maxTemp).precise =
       local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
       precise;
  _Var7._4_4_ = local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
                super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._20_4_;
  _Var7._M_payload._M_value =
       (int)local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
            super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
            tempValue.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_payload;
  (this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = _Var7;
  *(undefined4 *)
   &(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload =
       local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._48_4_;
  *(undefined4 *)
   ((long)&(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload + 4) =
       local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._52_4_;
  (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.hourValue =
       local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._56_4_;
  (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.minuteValue =
       local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._60_4_;
  *(undefined4 *)
   &(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged =
       local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._64_4_;
  if (((this->minTemp).freezing != false) || ((this->maxTemp).freezing == false)) {
    uVar12 = local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._48_4_;
    if (((this->minTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_engaged == true) &&
       (uVar12 = (undefined4)
                 (this->minTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_payload._M_value,
       (this->minTemp).precise == true)) {
      uVar12 = (float)uVar12 * 0.1;
    }
    if (((this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_engaged == true) &&
       (in_XMM1_Da = (float)(this->maxTemp).tempValue.super__Optional_base<int,_true,_true>.
                            _M_payload.super__Optional_payload_base<int>._M_payload._M_value,
       (this->maxTemp).precise == true)) {
      in_XMM1_Da = in_XMM1_Da * 0.1;
    }
    if ((float)uVar12 <= in_XMM1_Da) goto LAB_001ab81e;
  }
  uVar12._0_1_ = (this->minTemp).freezing;
  uVar12._1_1_ = (this->minTemp).precise;
  uVar12._2_2_ = *(undefined2 *)&(this->minTemp).field_0xa;
  _Var4 = (pTVar1->tempValue).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>;
  (this->minTemp).freezing =
       (bool)local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._24_1_;
  (this->minTemp).precise =
       local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
       precise;
  _Var8._4_4_ = local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
                super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._20_4_;
  _Var8._M_payload._M_value =
       (int)local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
            super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
            tempValue.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_payload;
  (pTVar1->tempValue).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = _Var8;
  uStack_70 = (undefined2)uVar12;
  (this->maxTemp).freezing = (bool)(undefined1)uStack_70;
  (this->maxTemp).precise = (bool)uStack_70._1_1_;
  (this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = _Var4;
  poVar2 = &this->minTime;
  bVar3 = (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged;
  if ((this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged == true) {
    if (bVar3 == false) {
      uVar6 = *(undefined8 *)
               ((long)&(this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload
                       .super__Optional_payload_base<metaf::MetafTime>._M_payload + 8);
      (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload_base<unsigned_int>)
           (poVar2->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
           super__Optional_base<unsigned_int,_true,_true>._M_payload;
      *(undefined8 *)
       ((long)&(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = uVar6;
      (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = true;
      (this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = false;
    }
    else {
      _Var5._M_payload.super__Optional_payload_base<unsigned_int> =
           (poVar2->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
           super__Optional_base<unsigned_int,_true,_true>._M_payload;
      uVar6 = *(undefined8 *)
               ((long)&(this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload
                       .super__Optional_payload_base<metaf::MetafTime>._M_payload + 8);
      _Var10._M_payload.super__Optional_payload_base<unsigned_int>._4_4_ =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._52_4_;
      _Var10._M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value =
           local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._48_4_;
      (poVar2->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           _Var10._M_payload.super__Optional_payload_base<unsigned_int>;
      *(ulong *)((long)&(this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>.
                        _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) =
           CONCAT44(local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                    _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>.
                    _M_payload._60_4_,
                    local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                    _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>.
                    _M_payload._56_4_);
      (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           _Var5._M_payload.super__Optional_payload_base<unsigned_int>;
      *(undefined8 *)
       ((long)&(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = uVar6;
    }
  }
  else if (bVar3 != false) {
    _Var11._M_payload.super__Optional_payload_base<unsigned_int>._4_4_ =
         local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._52_4_;
    _Var11._M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value =
         local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._48_4_;
    (poVar2->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         _Var11._M_payload.super__Optional_payload_base<unsigned_int>;
    *(ulong *)((long)&(this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) =
         CONCAT44(local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                  _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload.
                  _60_4_,local_5c.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                         _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>.
                         _M_payload._56_4_);
    (this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged = true;
    (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged = false;
  }
LAB_001ab81e:
  this->isIncomplete = false;
  return APPENDED;
}

Assistant:

AppendResult MinMaxTemperatureGroup::appendForecast(const std::string & group) {
	static const auto error = AppendResult::NOT_APPENDED;
	if (minTemp.isReported() && maxTemp.isReported() && !isIncomplete) return error;
	const auto nextGroup = fromForecast(group);
	if (!nextGroup.has_value()) return error;
	if (isIncomplete != nextGroup->isIncomplete) return error;
	if (!isIncomplete) {
		// Minimum or maximum temperature point specified explicitly
		// Get minimum either from *this or from nextGroup, and maximum from other group
		// Make sure appending two minimums or two maximums will result in error
		if (minTemp.isReported() && nextGroup->minTemp.isReported()) return error;
		if (maxTemp.isReported() && nextGroup->maxTemp.isReported()) return error;
		if (!minTemp.isReported() && nextGroup->minTemp.isReported()) {
			minTemp = nextGroup->minTemp;
			minTime = nextGroup->minTime;
		}
		if (!maxTemp.isReported() && nextGroup->maxTemp.isReported()) {
			maxTemp = nextGroup->maxTemp;
			maxTime = nextGroup->maxTime;
		}
		if (!minTemp.isReported() || !maxTemp.isReported()) return error;
	} else {
		maxTemp = nextGroup->maxTemp;
		maxTime = nextGroup->maxTime;
		if ((!minTemp.isFreezing() && maxTemp.isFreezing()) || 
			*minTemp.temperature() > *maxTemp.temperature())
		{
			std::swap(minTemp, maxTemp);
			std::swap(minTime, maxTime);
		}
		isIncomplete = false;
	}
	return AppendResult::APPENDED;
}